

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

void __thiscall QPDFObjectHandle::QPDFDictItems::iterator::updateIValue(iterator *this)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  reference pbVar4;
  QPDFObjectHandle local_38;
  QPDFObjectHandle local_28;
  _Self local_18;
  iterator *local_10;
  iterator *this_local;
  
  local_10 = this;
  peVar2 = std::
           __shared_ptr_access<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m);
  peVar3 = std::
           __shared_ptr_access<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m);
  local_18._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&peVar3->keys);
  bVar1 = std::operator==(&peVar2->iter,&local_18);
  peVar2 = std::
           __shared_ptr_access<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m);
  peVar2->is_end = bVar1;
  peVar2 = std::
           __shared_ptr_access<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m);
  if ((peVar2->is_end & 1U) == 0) {
    peVar2 = std::
             __shared_ptr_access<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m);
    pbVar4 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&peVar2->iter);
    std::__cxx11::string::operator=((string *)&this->ivalue,(string *)pbVar4);
    peVar2 = std::
             __shared_ptr_access<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m);
    getKey(&local_38,(string *)peVar2->oh);
    QPDFObjectHandle::operator=(&(this->ivalue).second,&local_38);
    ~QPDFObjectHandle(&local_38);
  }
  else {
    std::__cxx11::string::operator=((string *)&this->ivalue,"");
    memset(&local_28,0,0x10);
    QPDFObjectHandle(&local_28);
    QPDFObjectHandle::operator=(&(this->ivalue).second,&local_28);
    ~QPDFObjectHandle(&local_28);
  }
  return;
}

Assistant:

void
QPDFObjectHandle::QPDFDictItems::iterator::updateIValue()
{
    m->is_end = (m->iter == m->keys.end());
    if (m->is_end) {
        this->ivalue.first = "";
        this->ivalue.second = QPDFObjectHandle();
    } else {
        this->ivalue.first = *(m->iter);
        this->ivalue.second = m->oh.getKey(this->ivalue.first);
    }
}